

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_utils.h
# Opt level: O3

bool Gudhi::read_simplex<int,double>
               (istream *in_,vector<int,_std::allocator<int>_> *simplex,double *fil)

{
  iterator __position;
  long *plVar1;
  istream *piVar2;
  int iVar3;
  int dim;
  int v;
  int local_30;
  int local_2c;
  
  local_30 = 0;
  plVar1 = (long *)std::istream::operator>>((istream *)in_,&local_30);
  if ((*(byte *)((long)plVar1 + *(long *)(*plVar1 + -0x18) + 0x20) & 5) == 0) {
    if (-1 < local_30) {
      iVar3 = -1;
      do {
        plVar1 = (long *)std::istream::operator>>((istream *)in_,&local_2c);
        if ((*(byte *)((long)plVar1 + *(long *)(*plVar1 + -0x18) + 0x20) & 5) != 0) {
          return false;
        }
        __position._M_current =
             (simplex->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (simplex->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
            ._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)simplex,__position,&local_2c);
        }
        else {
          *__position._M_current = local_2c;
          (simplex->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_finish = __position._M_current + 1;
        }
        iVar3 = iVar3 + 1;
      } while (iVar3 < local_30);
    }
    piVar2 = std::istream::_M_extract<double>((double *)in_);
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) == 0) {
      std::istream::ignore((long)in_,-1);
      return true;
    }
  }
  return false;
}

Assistant:

bool read_simplex(std::istream& in_, std::vector<Vertex_handle>& simplex, Filtration_value& fil) {
  int dim = 0;
  if (!(in_ >> dim)) return false;
  Vertex_handle v;
  for (int i = 0; i < dim + 1; ++i) {
    if (!(in_ >> v)) return false;
    simplex.push_back(v);
  }
  if (!(in_ >> fil)) return false;
  in_.ignore((std::numeric_limits<std::streamsize>::max)(), '\n');  // ignore until the carriage return
  return true;
}